

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void ExpectedError(string *TestCase,JSONErrorType Raised,JSONErrorType Expected)

{
  ostream *poVar1;
  string local_60;
  string local_40;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Case: ");
  poVar1 = std::operator<<(poVar1,(string *)TestCase);
  if (Raised == Expected) {
    poVar1 = std::operator<<(poVar1,": The raised exception is equal the expected one! ENUM: ");
    GetEnumName_abi_cxx11_(&local_60,Raised);
    poVar1 = std::operator<<(poVar1,(string *)&local_60);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    poVar1 = std::operator<<(poVar1,": Raised: ");
    GetEnumName_abi_cxx11_(&local_60,Raised);
    poVar1 = std::operator<<(poVar1,(string *)&local_60);
    poVar1 = std::operator<<(poVar1," != Expected: ");
    GetEnumName_abi_cxx11_(&local_40,Expected);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void ExpectedError(string TestCase, JSONErrorType Raised, JSONErrorType Expected)
{
    if(Raised == Expected)
        cout << "Case: " << TestCase << ": The raised exception is equal the expected one! ENUM: " << GetEnumName(Raised) << endl;
    else
        cout << "Case: " << TestCase << ": Raised: " << GetEnumName(Raised) << " != Expected: " << GetEnumName(Expected) << endl;
}